

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_32f1a0::SpecialSubstitution::printLeft(SpecialSubstitution *this,OutputStream *S)

{
  StringView local_78;
  StringView local_68;
  StringView local_58;
  StringView local_48;
  StringView local_38;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  SpecialSubstitution *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  switch(*(undefined4 *)&(this->super_Node).field_0xc) {
  case 0:
    StringView::StringView(&local_28,"std::allocator");
    OutputStream::operator+=(local_18,local_28);
    break;
  case 1:
    StringView::StringView(&local_38,"std::basic_string");
    OutputStream::operator+=(local_18,local_38);
    break;
  case 2:
    StringView::StringView(&local_48,"std::string");
    OutputStream::operator+=(local_18,local_48);
    break;
  case 3:
    StringView::StringView(&local_58,"std::istream");
    OutputStream::operator+=(local_18,local_58);
    break;
  case 4:
    StringView::StringView(&local_68,"std::ostream");
    OutputStream::operator+=(local_18,local_68);
    break;
  case 5:
    StringView::StringView(&local_78,"std::iostream");
    OutputStream::operator+=(local_18,local_78);
  }
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    switch (SSK) {
    case SpecialSubKind::allocator:
      S += "std::allocator";
      break;
    case SpecialSubKind::basic_string:
      S += "std::basic_string";
      break;
    case SpecialSubKind::string:
      S += "std::string";
      break;
    case SpecialSubKind::istream:
      S += "std::istream";
      break;
    case SpecialSubKind::ostream:
      S += "std::ostream";
      break;
    case SpecialSubKind::iostream:
      S += "std::iostream";
      break;
    }
  }